

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

ssize_t nettlp_pcie_cfg_read(nettlp_pcie_cfg *ntpc,uint16_t addr,void *buf,size_t count)

{
  ushort uVar1;
  int iVar2;
  long in_RCX;
  void *in_RDX;
  ushort in_SI;
  int lstpad;
  int fstpad;
  uint16_t end_dwaddr;
  uint16_t start_dwaddr;
  int read;
  int len;
  uint8_t *ptr;
  uint32_t data;
  uint8_t mask;
  uint16_t dwaddr;
  int ret;
  int local_54;
  ushort local_4c;
  int iVar3;
  int in_stack_ffffffffffffffbc;
  undefined1 *in_stack_ffffffffffffffc0;
  nettlp_pcie_cfg *in_stack_ffffffffffffffc8;
  ushort local_2e;
  void *local_20;
  long local_8;
  
  iVar3 = 0;
  local_54 = 4 - ((uint)in_SI + (int)in_RCX & 3);
  uVar1 = (ushort)((int)(uint)in_SI >> 2);
  local_4c = (ushort)((ulong)in_SI + in_RCX >> 2);
  local_2e = uVar1;
  local_20 = in_RDX;
  if (local_54 == 4) {
    local_54 = 0;
    local_4c = local_4c - 1;
  }
  while ((iVar2 = iVar3, local_2e <= local_4c &&
         (iVar2 = pcie_cfg_read_dw(in_stack_ffffffffffffffc8,
                                   (uint16_t)((ulong)in_stack_ffffffffffffffc0 >> 0x30),
                                   (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x28),
                                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffbc,iVar3)),
         -1 < iVar2))) {
    in_stack_ffffffffffffffbc = 4;
    in_stack_ffffffffffffffc0 = &stack0xffffffffffffffcc;
    if ((local_2e == uVar1) && ((in_SI & 3) != 0)) {
      in_stack_ffffffffffffffbc = 4 - (in_SI & 3);
      in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + (int)(in_SI & 3);
    }
    if ((local_2e == local_4c) && (local_54 != 0)) {
      in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc - local_54;
    }
    memcpy(local_20,in_stack_ffffffffffffffc0,(long)in_stack_ffffffffffffffbc);
    local_20 = (void *)((long)local_20 + (long)in_stack_ffffffffffffffbc);
    iVar3 = in_stack_ffffffffffffffbc + iVar3;
    local_2e = local_2e + 1;
  }
  local_8 = (long)iVar2;
  return local_8;
}

Assistant:

ssize_t nettlp_pcie_cfg_read(struct nettlp_pcie_cfg *ntpc, uint16_t addr,
			     void *buf, size_t count)
{
	int ret;
	uint16_t dwaddr;
	uint8_t mask;
	uint32_t data;
	uint8_t *ptr;

	int len, read = 0;
	uint16_t start_dwaddr, end_dwaddr;
	int fstpad;	/* unnecessary bytes in first DWORD */
	int lstpad;	/* unnecessary bytes in last DWORD */

	fstpad = addr & 0x0003;
	lstpad = 4 - ((addr + count) & 0x0003);

	start_dwaddr = addr >> 2;
	end_dwaddr = (addr + count) >> 2;
	/* A cornor case: If (addr + count) is a multple of 4, lastpad
	 * becomes 4, which means no need to read the end dword.
	 * Thus, decrement end_dwaddr and set lstpad 0.
	 */
	if (lstpad == 4) {
		lstpad = 0;
		end_dwaddr--;
	}

	for (dwaddr = start_dwaddr; dwaddr <= end_dwaddr; dwaddr++) {

		mask = 0xF;
		if (dwaddr == start_dwaddr && fstpad) {
			mask &= ((0x0F << fstpad) & 0x0F);
		}
		if (dwaddr == end_dwaddr && lstpad) {
			mask &= ((0x0F >> lstpad) & 0x0F);
		}

		ret = pcie_cfg_read_dw(ntpc, dwaddr, mask, &data);
		if (ret < 0)
			return ret;

		len = 4;
		ptr = (uint8_t *)&data;
		if (dwaddr == start_dwaddr && fstpad) {
			len -= fstpad;
			ptr += fstpad;
		}
		if (dwaddr == end_dwaddr && lstpad) {
			len -= lstpad;
		}

		memcpy(buf, ptr, len);
		buf += len;
		read += len;
	}

	return read;
}